

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::AsyncOutputStream> __thiscall
kj::anon_unknown_30::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  AsyncOutputStream *pAVar1;
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream> OVar2;
  uint local_28;
  uint local_24;
  Own<kj::(anonymous_namespace)::AsyncStreamFd> local_20;
  
  local_24 = flags;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&>
            ((kj *)&local_20,(UnixEventPort *)(CONCAT44(in_register_00000034,fd) + 8),
             (int *)&local_24,&local_28);
  (this->super_LowLevelAsyncIoProvider)._vptr_LowLevelAsyncIoProvider =
       (_func_int **)local_20.disposer;
  pAVar1 = &((local_20.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
            super_AsyncOutputStream;
  if (local_20.ptr == (AsyncStreamFd *)0x0) {
    pAVar1 = (AsyncOutputStream *)0x0;
  }
  (this->eventPort).super_EventPort._vptr_EventPort = (_func_int **)pAVar1;
  local_20.ptr = (AsyncStreamFd *)0x0;
  Own<kj::(anonymous_namespace)::AsyncStreamFd>::~Own(&local_20);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags);
  }